

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3auxOpenMethod(sqlite3_vtab *pVTab,sqlite3_vtab_cursor **ppCsr)

{
  int iVar1;
  sqlite3_vtab_cursor *__s;
  
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    __s = (sqlite3_vtab_cursor *)sqlite3Malloc(0xa8);
  }
  else {
    __s = (sqlite3_vtab_cursor *)0x0;
  }
  if (__s == (sqlite3_vtab_cursor *)0x0) {
    iVar1 = 7;
  }
  else {
    iVar1 = 0;
    memset(__s,0,0xa8);
    *ppCsr = __s;
  }
  return iVar1;
}

Assistant:

static int fts3auxOpenMethod(sqlite3_vtab *pVTab, sqlite3_vtab_cursor **ppCsr){
  Fts3auxCursor *pCsr;            /* Pointer to cursor object to return */

  UNUSED_PARAMETER(pVTab);

  pCsr = (Fts3auxCursor *)sqlite3_malloc(sizeof(Fts3auxCursor));
  if( !pCsr ) return SQLITE_NOMEM;
  memset(pCsr, 0, sizeof(Fts3auxCursor));

  *ppCsr = (sqlite3_vtab_cursor *)pCsr;
  return SQLITE_OK;
}